

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

int yaml_emitter_increase_indent(yaml_emitter_t *emitter,int flow,int indentless)

{
  int *piVar1;
  int iVar2;
  
  if (((emitter->indents).top == (emitter->indents).end) &&
     (iVar2 = yaml_stack_extend(&(emitter->indents).start,&(emitter->indents).top,
                                &(emitter->indents).end), iVar2 == 0)) {
    emitter->error = YAML_MEMORY_ERROR;
    return 0;
  }
  iVar2 = emitter->indent;
  piVar1 = (emitter->indents).top;
  (emitter->indents).top = piVar1 + 1;
  *piVar1 = iVar2;
  if (emitter->indent < 0) {
    if (flow == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = emitter->best_indent;
    }
    emitter->indent = iVar2;
  }
  else if (indentless == 0) {
    emitter->indent = emitter->indent + emitter->best_indent;
  }
  return 1;
}

Assistant:

static int
yaml_emitter_increase_indent(yaml_emitter_t *emitter,
        int flow, int indentless)
{
    if (!PUSH(emitter, emitter->indents, emitter->indent))
        return 0;

    if (emitter->indent < 0) {
        emitter->indent = flow ? emitter->best_indent : 0;
    }
    else if (!indentless) {
        emitter->indent += emitter->best_indent;
    }

    return 1;
}